

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O3

string * __thiscall
primesieve::CpuInfo::cpuName_abi_cxx11_(string *__return_storage_ptr__,CpuInfo *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  iterator iVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *plVar9;
  ulong uVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string line;
  string label;
  ifstream file;
  allocator_type local_329;
  string *local_328;
  string local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8;
  undefined7 uStack_2c7;
  string local_2b8;
  undefined8 *local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined1 local_280;
  undefined1 local_27f;
  undefined8 *local_278 [2];
  undefined8 local_268;
  long *local_258 [2];
  long local_248 [2];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_328 = __return_storage_ptr__;
  std::ifstream::ifstream((istream *)local_238,"/proc/cpuinfo",_S_in);
  local_300 = &local_2f0;
  local_2f8 = 0;
  local_2f0._M_local_buf[0] = '\0';
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_2d8 = &local_2c8;
    local_2d0 = 0;
    local_2c8 = 0;
    local_2e0 = &__return_storage_ptr__->field_2;
    uVar10 = 0;
    do {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2d8,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8,CONCAT71(uStack_2c7,local_2c8) + 1);
        }
        (local_328->_M_dataplus)._M_p = (pointer)local_2e0;
        paVar8 = local_2e0;
        __return_storage_ptr__ = local_328;
        if (local_300 == &local_2f0) goto LAB_00125fb2;
        (local_328->_M_dataplus)._M_p = (pointer)local_300;
        (local_328->field_2)._M_allocated_capacity =
             CONCAT71(local_2f0._M_allocated_capacity._1_7_,local_2f0._M_local_buf[0]);
        goto LAB_00125fb8;
      }
      if ((anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::cpuLabels_abi_cxx11_ ==
          '\0') {
        iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)
                                     ::cpuLabels_abi_cxx11_);
        if (iVar3 != 0) {
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          local_2b8.field_2._M_allocated_capacity = 0x616e206c65646f6d;
          local_2b8.field_2._8_2_ = 0x656d;
          local_2b8._M_string_length = 10;
          local_2b8.field_2._M_local_buf[10] = '\0';
          local_298 = &local_288;
          local_288 = 0x6f737365636f7250;
          local_280 = 0x72;
          local_290 = 9;
          local_27f = 0;
          local_278[0] = &local_268;
          local_268._2_1_ = 0x75;
          local_268._0_2_ = 0x7063;
          local_278[1] = (undefined8 *)0x3;
          local_268._3_1_ = 0;
          __l._M_len = 3;
          __l._M_array = &local_2b8;
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                   cpuLabels_abi_cxx11_,__l,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_258,&local_329);
          lVar5 = -0x60;
          plVar9 = &local_268;
          do {
            if (plVar9 != (long *)plVar9[-2]) {
              operator_delete((long *)plVar9[-2],*plVar9 + 1);
            }
            plVar9 = plVar9 + -4;
            lVar5 = lVar5 + 0x20;
          } while (lVar5 != 0);
          __cxa_atexit(std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::~set,(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                              cpuLabels_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                               cpuLabels_abi_cxx11_);
        }
      }
      lVar5 = std::__cxx11::string::find((char)&local_2d8,0x3a);
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_320._M_string_length = 0;
      local_320.field_2._M_local_buf[0] = '\0';
      if (lVar5 != -1) {
        std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_2d8);
        anon_unknown.dwarf_1101f3::trimString(&local_2b8);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                          cpuLabels_abi_cxx11_,&local_2b8);
        if (iVar6._M_node !=
            (_Base_ptr)
            ((anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::cpuLabels_abi_cxx11_ +
            8)) {
          std::__cxx11::string::substr((ulong)local_258,(ulong)&local_2d8);
          std::__cxx11::string::operator=((string *)&local_320,(string *)local_258);
          if (local_258[0] != local_248) {
            operator_delete(local_258[0],local_248[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
      }
      anon_unknown.dwarf_1101f3::trimString(&local_320);
      if (local_320._M_string_length == 0) {
LAB_00126198:
        uVar10 = uVar10 + 1;
        bVar1 = true;
        if (10 < uVar10) {
          (local_328->_M_dataplus)._M_p = (pointer)local_2e0;
          paVar8 = &local_2f0;
          if (local_300 == paVar8) {
            local_2e0->_M_allocated_capacity =
                 CONCAT71(local_2f0._M_allocated_capacity._1_7_,local_2f0._M_local_buf[0]);
            *(undefined8 *)((long)local_2e0 + 8) = local_2f0._8_8_;
          }
          else {
            (local_328->_M_dataplus)._M_p = (pointer)local_300;
            (local_328->field_2)._M_allocated_capacity =
                 CONCAT71(local_2f0._M_allocated_capacity._1_7_,local_2f0._M_local_buf[0]);
          }
          local_328->_M_string_length = local_2f8;
          psVar7 = &local_2f8;
          local_300 = paVar8;
          goto LAB_00126205;
        }
      }
      else {
        lVar5 = std::__cxx11::string::find_first_not_of((char *)&local_320,0x130144,0);
        if (lVar5 == -1) goto LAB_00126198;
        (local_328->_M_dataplus)._M_p = (pointer)local_2e0;
        paVar8 = &local_320.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p == paVar8) {
          local_2e0->_M_allocated_capacity =
               CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                        local_320.field_2._M_local_buf[0]);
          *(undefined8 *)((long)local_2e0 + 8) = local_320.field_2._8_8_;
        }
        else {
          (local_328->_M_dataplus)._M_p = local_320._M_dataplus._M_p;
          (local_328->field_2)._M_allocated_capacity =
               CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                        local_320.field_2._M_local_buf[0]);
        }
        local_328->_M_string_length = local_320._M_string_length;
        psVar7 = &local_320._M_string_length;
        local_320._M_dataplus._M_p = (pointer)paVar8;
LAB_00126205:
        *psVar7 = 0;
        paVar8->_M_local_buf[0] = '\0';
        bVar1 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                                 local_320.field_2._M_local_buf[0]) + 1);
      }
    } while (bVar1);
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,CONCAT71(uStack_2c7,local_2c8) + 1);
    }
    __return_storage_ptr__ = local_328;
    if (local_300 != &local_2f0) {
      operator_delete(local_300,
                      CONCAT71(local_2f0._M_allocated_capacity._1_7_,local_2f0._M_local_buf[0]) + 1)
      ;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar8 = &__return_storage_ptr__->field_2;
LAB_00125fb2:
    paVar8->_M_allocated_capacity =
         CONCAT71(local_2f0._M_allocated_capacity._1_7_,local_2f0._M_local_buf[0]);
    *(undefined8 *)((long)paVar8 + 8) = local_2f0._8_8_;
LAB_00125fb8:
    __return_storage_ptr__->_M_string_length = local_2f8;
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

string CpuInfo::cpuName() const
{
  try
  {
    // On Linux we get the CPU name by parsing /proc/cpuinfo
    // which can be quite slow on PCs without fast SSD.
    // For this reason we don't initialize the CPU name at
    // startup but instead we lazy load it when needed.
    return getCpuName();
  }
  catch (exception&)
  {
    return {};
  }
}